

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O1

SEND_CALLBACK_DATA *
enqueue_send_callback_data
          (IOTHUB_MESSAGING_HANDLE messagingHandle,
          IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback,void *userContext)

{
  size_t sVar1;
  SEND_CALLBACK_DATA *item;
  LIST_ITEM_HANDLE pLVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (messagingHandle->send_queue_size < messagingHandle->max_send_queue_size) {
    item = (SEND_CALLBACK_DATA *)malloc(0x20);
    if (item == (SEND_CALLBACK_DATA *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "Failed allocating SEND_CALLBACK_DATA";
        iVar4 = 0x71;
        goto LAB_00136038;
      }
    }
    else {
      sVar1 = messagingHandle->next_send_data_id;
      messagingHandle->next_send_data_id = sVar1 + 1;
      item->id = sVar1;
      item->messagingHandle = messagingHandle;
      item->callback = sendCompleteCallback;
      item->userContext = userContext;
      pLVar2 = singlylinkedlist_add(messagingHandle->send_callback_data,item);
      if (pLVar2 != (LIST_ITEM_HANDLE)0x0) {
        messagingHandle->send_queue_size = messagingHandle->send_queue_size + 1;
        return item;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"enqueue_send_callback_data",0x80,1,"Failed adding context to send_callback_data"
                 );
      }
      free(item);
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "Send queue is full";
      iVar4 = 0x69;
LAB_00136038:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"enqueue_send_callback_data",iVar4,1,pcVar5);
      return (SEND_CALLBACK_DATA *)0x0;
    }
  }
  return (SEND_CALLBACK_DATA *)0x0;
}

Assistant:

static SEND_CALLBACK_DATA* enqueue_send_callback_data(IOTHUB_MESSAGING_HANDLE messagingHandle, IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback, void* userContext)
{
    SEND_CALLBACK_DATA* result = NULL;

    if (is_send_queue_full(messagingHandle))
    {
        LogError("Send queue is full");
    }
    else
    {
        result = malloc(sizeof(SEND_CALLBACK_DATA));

        if (result == NULL)
        {
            LogError("Failed allocating SEND_CALLBACK_DATA");
        }
        else
        {
            // There is a possible type overflow here in next_send_data_id, which could be
            // bad if another SEND_CALLBACK_DATA is already in the queue with the same id.
            // However that is extremely unlikely, since there would need to be SIZE_MAX + 1
            // items in the send_callback_data list.
            result->id = messagingHandle->next_send_data_id++;
            result->messagingHandle = messagingHandle;
            result->callback = sendCompleteCallback;
            result->userContext = userContext;

            if (singlylinkedlist_add(messagingHandle->send_callback_data, result) == NULL)
            {
                LogError("Failed adding context to send_callback_data");
                free(result);
                result = NULL;
            }
            else
            {
                messagingHandle->send_queue_size++;
            }
        }
    }

    return result;
}